

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

uint256 * __thiscall node::anon_unknown_2::NodeImpl::getBestBlockHash(NodeImpl *this)

{
  CBlockIndex *pCVar1;
  CBlockIndex *in_RSI;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *tip;
  ChainstateManager *this_00;
  CBlockIndex *this_01;
  anon_class_8_1_8991fb9c *this_02;
  
  this_02 = *(anon_class_8_1_8991fb9c **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_RDI);
  pCVar1 = getBestBlockHash::anon_class_8_1_8991fb9c::operator()(this_02);
  if (pCVar1 == (CBlockIndex *)0x0) {
    chainman((NodeImpl *)this_00);
    ChainstateManager::GetParams(this_00);
    CChainParams::GenesisBlock((CChainParams *)this_00);
    CBlockHeader::GetHash((CBlockHeader *)this_01);
  }
  else {
    CBlockIndex::GetBlockHash(in_RSI);
  }
  if (*(anon_class_8_1_8991fb9c **)(in_FS_OFFSET + 0x28) == this_02) {
    return (uint256 *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint256 getBestBlockHash() override
    {
        const CBlockIndex* tip = WITH_LOCK(::cs_main, return chainman().ActiveChain().Tip());
        return tip ? tip->GetBlockHash() : chainman().GetParams().GenesisBlock().GetHash();
    }